

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509_crt.c
# Opt level: O0

int x509_get_certificate_policies(uchar **p,uchar *end,mbedtls_x509_sequence *certificate_policies)

{
  void *__s2;
  mbedtls_asn1_buf *pmVar1;
  int iVar2;
  uchar *end_00;
  void *pvVar3;
  bool bVar4;
  uchar *policy_end;
  mbedtls_x509_buf policy_oid;
  mbedtls_asn1_sequence *cur;
  mbedtls_asn1_buf *buf;
  size_t len;
  int parse_ret;
  int ret;
  mbedtls_x509_sequence *certificate_policies_local;
  uchar *end_local;
  uchar **p_local;
  
  len._0_4_ = 0;
  _parse_ret = certificate_policies;
  certificate_policies_local = (mbedtls_x509_sequence *)end;
  end_local = (uchar *)p;
  len._4_4_ = mbedtls_asn1_get_tag(p,end,(size_t *)&buf,0x30);
  if (len._4_4_ == 0) {
    if ((mbedtls_x509_sequence *)((long)&buf->tag + *(long *)end_local) ==
        certificate_policies_local) {
      if (buf == (mbedtls_asn1_buf *)0x0) {
        p_local._4_4_ =
             mbedtls_error_add(-0x2500,-0x66,
                               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/x509_crt.c"
                               ,0x2fa);
      }
      else {
        len._4_4_ = 0;
        policy_oid.p = (uchar *)certificate_policies;
        do {
          if (certificate_policies_local <= *(mbedtls_x509_sequence **)end_local) {
            policy_oid.p[0x18] = '\0';
            policy_oid.p[0x19] = '\0';
            policy_oid.p[0x1a] = '\0';
            policy_oid.p[0x1b] = '\0';
            policy_oid.p[0x1c] = '\0';
            policy_oid.p[0x1d] = '\0';
            policy_oid.p[0x1e] = '\0';
            policy_oid.p[0x1f] = '\0';
            if (*(mbedtls_x509_sequence **)end_local != certificate_policies_local) {
              iVar2 = mbedtls_error_add(-0x2500,-0x66,
                                        "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/x509_crt.c"
                                        ,0x351);
              return iVar2;
            }
            return (int)len;
          }
          len._4_4_ = mbedtls_asn1_get_tag
                                ((uchar **)end_local,(uchar *)certificate_policies_local,
                                 (size_t *)&buf,0x30);
          if (len._4_4_ != 0) {
            iVar2 = mbedtls_error_add(-0x2500,len._4_4_,
                                      "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/x509_crt.c"
                                      ,0x306);
            return iVar2;
          }
          end_00 = (uchar *)((long)&buf->tag + *(long *)end_local);
          len._4_4_ = mbedtls_asn1_get_tag((uchar **)end_local,end_00,(size_t *)&buf,6);
          pmVar1 = buf;
          if (len._4_4_ != 0) {
            iVar2 = mbedtls_error_add(-0x2500,len._4_4_,
                                      "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/x509_crt.c"
                                      ,0x30d);
            return iVar2;
          }
          __s2 = *(void **)end_local;
          bVar4 = true;
          if (buf == (mbedtls_asn1_buf *)0x4) {
            iVar2 = memcmp("U\x1d ",__s2,4);
            bVar4 = iVar2 != 0;
          }
          if (bVar4) {
            len._0_4_ = -0x2080;
          }
          if (*(long *)(policy_oid.p + 0x10) != 0) {
            if (*(long *)(policy_oid.p + 0x18) != 0) {
              return -0x2500;
            }
            pvVar3 = calloc(1,0x20);
            *(void **)(policy_oid.p + 0x18) = pvVar3;
            if (*(long *)(policy_oid.p + 0x18) == 0) {
              iVar2 = mbedtls_error_add(-0x2500,-0x6a,
                                        "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/x509_crt.c"
                                        ,0x329);
              return iVar2;
            }
            policy_oid.p = *(uchar **)(policy_oid.p + 0x18);
          }
          policy_oid.p[0] = '\x06';
          policy_oid.p[1] = '\0';
          policy_oid.p[2] = '\0';
          policy_oid.p[3] = '\0';
          *(void **)(policy_oid.p + 0x10) = __s2;
          *(mbedtls_asn1_buf **)(policy_oid.p + 8) = pmVar1;
          *(long *)end_local = (long)&buf->tag + *(long *)end_local;
          if (*(uchar **)end_local < end_00) {
            len._4_4_ = mbedtls_asn1_get_tag((uchar **)end_local,end_00,(size_t *)&buf,0x30);
            if (len._4_4_ != 0) {
              iVar2 = mbedtls_error_add(-0x2500,len._4_4_,
                                        "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/x509_crt.c"
                                        ,0x33e);
              return iVar2;
            }
            *(long *)end_local = (long)&buf->tag + *(long *)end_local;
            len._4_4_ = 0;
          }
        } while (*(uchar **)end_local == end_00);
        p_local._4_4_ =
             mbedtls_error_add(-0x2500,-0x66,
                               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/x509_crt.c"
                               ,0x348);
      }
    }
    else {
      p_local._4_4_ =
           mbedtls_error_add(-0x2500,-0x66,
                             "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/x509_crt.c"
                             ,0x2f2);
    }
  }
  else {
    p_local._4_4_ =
         mbedtls_error_add(-0x2500,len._4_4_,
                           "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/x509_crt.c"
                           ,0x2ed);
  }
  return p_local._4_4_;
}

Assistant:

static int x509_get_certificate_policies(unsigned char **p,
                                         const unsigned char *end,
                                         mbedtls_x509_sequence *certificate_policies)
{
    int ret, parse_ret = 0;
    size_t len;
    mbedtls_asn1_buf *buf;
    mbedtls_asn1_sequence *cur = certificate_policies;

    /* Get main sequence tag */
    ret = mbedtls_asn1_get_tag(p, end, &len,
                               MBEDTLS_ASN1_CONSTRUCTED | MBEDTLS_ASN1_SEQUENCE);
    if (ret != 0) {
        return MBEDTLS_ERROR_ADD(MBEDTLS_ERR_X509_INVALID_EXTENSIONS, ret);
    }

    if (*p + len != end) {
        return MBEDTLS_ERROR_ADD(MBEDTLS_ERR_X509_INVALID_EXTENSIONS,
                                 MBEDTLS_ERR_ASN1_LENGTH_MISMATCH);
    }

    /*
     * Cannot be an empty sequence.
     */
    if (len == 0) {
        return MBEDTLS_ERROR_ADD(MBEDTLS_ERR_X509_INVALID_EXTENSIONS,
                                 MBEDTLS_ERR_ASN1_LENGTH_MISMATCH);
    }

    while (*p < end) {
        mbedtls_x509_buf policy_oid;
        const unsigned char *policy_end;

        /*
         * Get the policy sequence
         */
        if ((ret = mbedtls_asn1_get_tag(p, end, &len,
                                        MBEDTLS_ASN1_CONSTRUCTED | MBEDTLS_ASN1_SEQUENCE)) != 0) {
            return MBEDTLS_ERROR_ADD(MBEDTLS_ERR_X509_INVALID_EXTENSIONS, ret);
        }

        policy_end = *p + len;

        if ((ret = mbedtls_asn1_get_tag(p, policy_end, &len,
                                        MBEDTLS_ASN1_OID)) != 0) {
            return MBEDTLS_ERROR_ADD(MBEDTLS_ERR_X509_INVALID_EXTENSIONS, ret);
        }

        policy_oid.tag = MBEDTLS_ASN1_OID;
        policy_oid.len = len;
        policy_oid.p = *p;

        /*
         * Only AnyPolicy is currently supported when enforcing policy.
         */
        if (MBEDTLS_OID_CMP(MBEDTLS_OID_ANY_POLICY, &policy_oid) != 0) {
            /*
             * Set the parsing return code but continue parsing, in case this
             * extension is critical.
             */
            parse_ret = MBEDTLS_ERR_X509_FEATURE_UNAVAILABLE;
        }

        /* Allocate and assign next pointer */
        if (cur->buf.p != NULL) {
            if (cur->next != NULL) {
                return MBEDTLS_ERR_X509_INVALID_EXTENSIONS;
            }

            cur->next = mbedtls_calloc(1, sizeof(mbedtls_asn1_sequence));

            if (cur->next == NULL) {
                return MBEDTLS_ERROR_ADD(MBEDTLS_ERR_X509_INVALID_EXTENSIONS,
                                         MBEDTLS_ERR_ASN1_ALLOC_FAILED);
            }

            cur = cur->next;
        }

        buf = &(cur->buf);
        buf->tag = policy_oid.tag;
        buf->p = policy_oid.p;
        buf->len = policy_oid.len;

        *p += len;

        /*
         * If there is an optional qualifier, then *p < policy_end
         * Check the Qualifier len to verify it doesn't exceed policy_end.
         */
        if (*p < policy_end) {
            if ((ret = mbedtls_asn1_get_tag(p, policy_end, &len,
                                            MBEDTLS_ASN1_CONSTRUCTED | MBEDTLS_ASN1_SEQUENCE)) !=
                0) {
                return MBEDTLS_ERROR_ADD(MBEDTLS_ERR_X509_INVALID_EXTENSIONS, ret);
            }
            /*
             * Skip the optional policy qualifiers.
             */
            *p += len;
        }

        if (*p != policy_end) {
            return MBEDTLS_ERROR_ADD(MBEDTLS_ERR_X509_INVALID_EXTENSIONS,
                                     MBEDTLS_ERR_ASN1_LENGTH_MISMATCH);
        }
    }

    /* Set final sequence entry's next pointer to NULL */
    cur->next = NULL;

    if (*p != end) {
        return MBEDTLS_ERROR_ADD(MBEDTLS_ERR_X509_INVALID_EXTENSIONS,
                                 MBEDTLS_ERR_ASN1_LENGTH_MISMATCH);
    }

    return parse_ret;
}